

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subprocess.cpp
# Opt level: O0

void llbuild::basic::spawnProcess
               (ProcessDelegate *delegate,ProcessContext *ctx,ProcessGroup *pgrp,
               ProcessHandle handle,ArrayRef<llvm::StringRef> commandLine,
               POSIXEnvironment *environment,ProcessAttributes attr,ProcessReleaseFn *releaseFn,
               ProcessCompletionFn *completionFn)

{
  ProcessResult __args;
  ProcessResult __args_00;
  ProcessResult __args_01;
  StringRef __args_02;
  int iVar1;
  bool bVar2;
  int iVar3;
  FileDescriptor FVar4;
  size_t sVar5;
  iterator __first;
  iterator __last;
  size_type sVar6;
  value_type pcVar7;
  reference ppcVar8;
  ulong uVar9;
  char *pcVar10;
  undefined8 uVar11;
  reference pvVar12;
  reference ptVar13;
  char **__argv;
  char **__envp;
  int *piVar14;
  mutex *__m;
  ProcessContext *pPVar15;
  lock_guard<std::mutex> *lock;
  anon_class_32_4_a872f8dc *__f;
  StringRef *pSVar16;
  error_code eVar17;
  ArrayRef<llvm::StringRef> Paths;
  StringRef Name;
  function<bool_(llvm::StringRef)> *local_1d00;
  byte local_1ce9;
  anon_class_104_8_1f81e8ee local_1bc0;
  function<void_()> local_1b58;
  undefined1 local_1b38 [8];
  shared_ptr<ManagedDescriptor> controlFdShared;
  shared_ptr<ManagedDescriptor> outputFdShared;
  Twine local_1b08;
  Twine local_1af0;
  Twine local_1ad8;
  Twine local_1ac0;
  Twine local_1aa8;
  size_type local_1a90;
  int local_1a84;
  size_t sStack_1a80;
  int err_1;
  ssize_t numBytes;
  undefined1 local_1a70 [4];
  int i_2;
  Twine local_1a58;
  Twine local_1a40;
  Twine local_1a28;
  Twine local_1a10;
  size_type local_19f8;
  int local_19ec;
  undefined1 local_19e8 [4];
  int err;
  char buf [4096];
  undefined1 auStack_9e0 [4];
  int threadCount;
  ControlProtocolState *local_9d8;
  ProcessContext *local_9d0;
  ProcessHandle local_9c8;
  anon_class_24_3_73e9511b local_9c0;
  undefined1 local_9a8 [8];
  function<bool_(llvm::StringRef)> readCbs [2];
  undefined1 local_948 [8];
  ControlProtocolState control;
  int nfds;
  short local_8e4;
  short sStack_8e2;
  bool activeEvents;
  pollfd readfds [2];
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  uint64_t local_8b8;
  undefined1 local_8b0 [8];
  ProcessResult result_2;
  ProcessInfo info;
  Twine local_878;
  byte local_859;
  string local_858;
  Twine local_838;
  Twine local_820;
  Twine local_808;
  Twine local_7f0;
  Twine local_7d8;
  Twine local_7c0;
  Twine local_7a8;
  Twine local_790;
  size_type local_778;
  undefined1 local_770 [8];
  ProcessResult processResult;
  int local_73c;
  undefined1 local_738 [3];
  bool workingDirectoryUnsupported;
  int result_1;
  string local_720;
  StringRef local_700;
  StringRef local_6f0;
  long local_6e0;
  longlong controlFd;
  llbuild_pid_t lStack_6d0;
  undefined4 uStack_6cc;
  uint64_t local_6c8;
  uint64_t uStack_6c0;
  uint64_t local_6b8;
  ProcessResult local_6b0;
  size_type local_688;
  Twine local_680;
  Twine local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  Twine local_610;
  Twine local_5f8;
  Twine local_5e0;
  size_type local_5c8;
  size_type local_5c0;
  allocator local_5b1;
  undefined1 local_5b0 [8];
  string whatPipe;
  pair<CommunicationPipesCreationError,_int> errorPair;
  ManagedDescriptor controlPipeChildEnd;
  ManagedDescriptor outputPipeChildEnd;
  lock_guard<std::mutex> local_550;
  lock_guard<std::mutex> guard;
  undefined1 local_540 [7];
  bool wasCancelled;
  error_category *local_538;
  ArrayRef<llvm::StringRef> local_530;
  sys *local_520;
  char *local_518;
  undefined1 local_510 [8];
  ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> res;
  string local_4d0;
  StringRef local_4b0;
  StringRef local_4a0;
  undefined1 local_490 [8];
  Twine taskID;
  ManagedDescriptor controlPipeParentEnd;
  ManagedDescriptor outputPipeParentEnd;
  PlatformSpecificPipesConfig *pipesConfig;
  string workingDir;
  undefined1 local_418 [7];
  bool usePosixSpawnChdirFallback;
  posix_spawn_file_actions_t fileActions;
  uint flags;
  int i_1;
  sigset_t mostSignals;
  sigset_t noSignals;
  posix_spawnattr_t attributes;
  size_t i;
  undefined1 local_160 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> args;
  undefined1 local_140 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argsStorage;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  uint64_t local_108;
  Twine local_f8;
  size_type local_e0;
  size_type local_d8;
  undefined1 local_d0 [8];
  ProcessResult result;
  llbuild_pid_t pid;
  ProcessGroup *pgrp_local;
  ProcessContext *ctx_local;
  ProcessDelegate *delegate_local;
  ArrayRef<llvm::StringRef> commandLine_local;
  ProcessHandle handle_local;
  
  pSVar16 = (StringRef *)commandLine.Length;
  delegate_local = (ProcessDelegate *)commandLine.Data;
  result.maxrss._4_4_ = 0xffffffff;
  if (((undefined1  [32])attr & (undefined1  [32])0x100) != (undefined1  [32])0x0) {
    attr.controlEnabled = false;
  }
  commandLine_local.Data = pSVar16;
  commandLine_local.Length = handle.id;
  sVar5 = llvm::ArrayRef<llvm::StringRef>::size((ArrayRef<llvm::StringRef> *)&delegate_local);
  if (sVar5 == 0) {
    ProcessResult::makeFailed((ProcessResult *)local_d0,-1);
    local_d8 = commandLine_local.Length;
    (*delegate->_vptr_ProcessDelegate[2])
              (delegate,ctx,commandLine_local.Length,(ulong)result.maxrss._4_4_);
    local_e0 = commandLine_local.Length;
    llvm::Twine::Twine(&local_f8,"no arguments for command");
    (*delegate->_vptr_ProcessDelegate[3])(delegate,ctx,local_e0,&local_f8);
    (*delegate->_vptr_ProcessDelegate[5])(delegate,ctx,commandLine_local.Length,local_d0);
    memcpy(&argsStorage.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage,local_d0,0x28);
    __args._8_8_ = uStack_120;
    __args._0_8_ = argsStorage.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __args.utime = local_118;
    __args.stime = uStack_110;
    __args.maxrss = local_108;
    std::function<void_(llbuild::basic::ProcessResult)>::operator()(completionFn,__args);
  }
  else {
    __first = llvm::ArrayRef<llvm::StringRef>::begin((ArrayRef<llvm::StringRef> *)&delegate_local);
    __last = llvm::ArrayRef<llvm::StringRef>::end((ArrayRef<llvm::StringRef> *)&delegate_local);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    vector<llvm::StringRef_const*,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_140,
               __first,__last,
               (allocator_type *)
               ((long)&args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_140);
    std::allocator<const_char_*>::allocator((allocator<const_char_*> *)((long)&i + 7));
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_160,sVar6 + 1,
               (allocator_type *)((long)&i + 7));
    std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)((long)&i + 7));
    attributes.__pad[0xe] = 0;
    attributes.__pad[0xf] = 0;
    for (; sVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_140), attributes.__pad._56_8_ != sVar6;
        attributes.__pad._56_8_ = attributes.__pad._56_8_ + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_140,attributes.__pad._56_8_);
      pcVar7 = (value_type)std::__cxx11::string::c_str();
      ppcVar8 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_160,
                           attributes.__pad._56_8_);
      *ppcVar8 = pcVar7;
    }
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_140);
    ppcVar8 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_160,sVar6);
    *ppcVar8 = (value_type)0x0;
    posix_spawnattr_init((posix_spawnattr_t *)(noSignals.__val + 0xf));
    sigemptyset((sigset_t *)(mostSignals.__val + 0xf));
    posix_spawnattr_setsigmask
              ((posix_spawnattr_t *)(noSignals.__val + 0xf),(sigset_t *)(mostSignals.__val + 0xf));
    sigemptyset((sigset_t *)&flags);
    for (fileActions.__pad[0xf] = 1; fileActions.__pad[0xf] < 0x1f;
        fileActions.__pad[0xf] = fileActions.__pad[0xf] + 1) {
      if ((fileActions.__pad[0xf] != 9) && (fileActions.__pad[0xf] != 0x13)) {
        sigaddset((sigset_t *)&flags,fileActions.__pad[0xf]);
      }
    }
    posix_spawnattr_setsigdefault((posix_spawnattr_t *)(noSignals.__val + 0xf),(sigset_t *)&flags);
    posix_spawnattr_setpgroup((posix_spawnattr_t *)(noSignals.__val + 0xf),0);
    fileActions.__pad[0xe] = 0xc;
    if ((attr.connectToConsole & 1U) == 0) {
      fileActions.__pad[0xe] = 0xe;
    }
    posix_spawnattr_setflags
              ((posix_spawnattr_t *)(noSignals.__val + 0xf),(short)fileActions.__pad[0xe]);
    posix_spawn_file_actions_init((posix_spawn_file_actions_t *)local_418);
    workingDir.field_2._M_local_buf[0xf] = '\x01';
    llvm::StringRef::str_abi_cxx11_((string *)&pipesConfig,&attr.workingDir);
    uVar9 = std::__cxx11::string::empty();
    if ((uVar9 & 1) == 0) {
      pcVar10 = (char *)std::__cxx11::string::c_str();
      iVar3 = posix_spawn_file_actions_addchdir((posix_spawn_file_actions_t *)local_418,pcVar10);
      if (iVar3 != 0x26) {
        workingDir.field_2._M_local_buf[0xf] = '\0';
      }
    }
    ManagedDescriptor::ManagedDescriptor
              ((ManagedDescriptor *)&controlPipeParentEnd._line,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp"
               ,799);
    ManagedDescriptor::ManagedDescriptor
              ((ManagedDescriptor *)&taskID.LHSKind,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp"
               ,800);
    llvm::Twine::utohexstr((Twine *)local_490,&commandLine_local.Length);
    strlen("LLBUILD_TASK_ID");
    llvm::Twine::str_abi_cxx11_(&local_4d0,(Twine *)local_490);
    uVar11 = std::__cxx11::string::data();
    local_4b0.Data = (char *)uVar11;
    uVar11 = std::__cxx11::string::length();
    local_4b0.Length = uVar11;
    POSIXEnvironment::setIfMissing(environment,local_4a0,local_4b0);
    std::__cxx11::string::~string((string *)&local_4d0);
    pvVar12 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_140,0);
    llvm::Twine::Twine((Twine *)&res.field_0x20,pvVar12);
    bVar2 = llvm::sys::path::is_absolute((Twine *)&res.field_0x20,native);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_140,0);
      local_520 = (sys *)std::__cxx11::string::data();
      local_518 = (char *)std::__cxx11::string::length();
      memset(&local_530,0,0x10);
      llvm::ArrayRef<llvm::StringRef>::ArrayRef(&local_530);
      Paths.Length = (size_type)pSVar16;
      Paths.Data = (StringRef *)local_530.Length;
      Name.Length = (size_t)local_530.Data;
      Name.Data = local_518;
      llvm::sys::findProgramByName_abi_cxx11_
                ((ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_510,local_520,Name,Paths);
      eVar17 = llvm::
               ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::getError((ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_510);
      local_538 = eVar17._M_cat;
      local_540._0_4_ = eVar17._M_value;
      bVar2 = std::error_code::operator_cast_to_bool((error_code *)local_540);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        ptVar13 = llvm::
                  ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*((ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_510);
        pvVar12 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_140,0);
        std::__cxx11::string::operator=((string *)pvVar12,(string *)ptVar13);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_140,0);
        pcVar7 = (value_type)std::__cxx11::string::c_str();
        ppcVar8 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_160,0);
        *ppcVar8 = pcVar7;
      }
      llvm::
      ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~ErrorOr((ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_510);
    }
    __m = &pgrp->mutex;
    std::lock_guard<std::mutex>::lock_guard(&local_550,__m);
    iVar3 = (int)__m;
    guard._M_device._7_1_ = ProcessGroup::isClosed(pgrp);
    if ((bool)guard._M_device._7_1_) {
      outputPipeChildEnd._20_4_ = 8;
    }
    else {
      ManagedDescriptor::ManagedDescriptor
                ((ManagedDescriptor *)&controlPipeChildEnd._line,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp"
                 ,0x34a);
      ManagedDescriptor::ManagedDescriptor
                ((ManagedDescriptor *)&errorPair,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp"
                 ,0x34b);
      whatPipe.field_2._8_8_ =
           createCommunicationPipes
                     (&attr,(PlatformSpecificPipesConfig *)local_418,
                      (ManagedDescriptor *)&controlPipeParentEnd._line,
                      (ManagedDescriptor *)&controlPipeChildEnd._line,
                      (ManagedDescriptor *)&taskID.LHSKind,(ManagedDescriptor *)&errorPair);
      if (whatPipe.field_2._8_4_ == 0) {
        bVar2 = ManagedDescriptor::isValid((ManagedDescriptor *)&errorPair);
        if (bVar2) {
          FVar4 = ManagedDescriptor::unsafeDescriptor((ManagedDescriptor *)&errorPair);
          local_6e0 = (long)FVar4;
          strlen("LLBUILD_CONTROL_FD");
          llvm::Twine::Twine((Twine *)local_738,&local_6e0);
          llvm::Twine::str_abi_cxx11_(&local_720,(Twine *)local_738);
          uVar11 = std::__cxx11::string::data();
          local_700.Data = (char *)uVar11;
          uVar11 = std::__cxx11::string::length();
          local_700.Length = uVar11;
          POSIXEnvironment::setIfMissing(environment,local_6f0,local_700);
          std::__cxx11::string::~string((string *)&local_720);
        }
        local_73c = 0;
        bVar2 = false;
        if ((workingDir.field_2._M_local_buf[0xf] & 1U) != 0) {
          uVar9 = std::__cxx11::string::empty();
          bVar2 = (uVar9 & 1) == 0;
          if (bVar2) {
            local_73c = -1;
          }
        }
        if (local_73c == 0) {
          ppcVar8 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_160,0);
          pcVar10 = *ppcVar8;
          __argv = std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                             ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_160);
          __envp = POSIXEnvironment::getEnvp(environment);
          local_73c = posix_spawn((pid_t *)((long)&result.maxrss + 4),pcVar10,
                                  (posix_spawn_file_actions_t *)local_418,
                                  (posix_spawnattr_t *)(noSignals.__val + 0xf),__argv,__envp);
        }
        processResult.maxrss = commandLine_local.Length;
        (*delegate->_vptr_ProcessDelegate[2])
                  (delegate,ctx,commandLine_local.Length,(ulong)result.maxrss._4_4_);
        if (local_73c == 0) {
          result_2.maxrss._6_1_ = (bool)(attr.canSafelyInterrupt & 1);
          lock = &local_550;
          result_2.maxrss._7_1_ = result_2.maxrss._6_1_;
          ProcessGroup::add(pgrp,lock,result.maxrss._4_4_,result_2.maxrss._6_1_);
          iVar3 = (int)lock;
        }
        else {
          ProcessResult::makeFailed((ProcessResult *)local_770,-1);
          local_778 = commandLine_local.Length;
          local_859 = 0;
          if (bVar2) {
            llvm::Twine::Twine(&local_790,"working-directory unsupported on this platform");
          }
          else {
            llvm::Twine::Twine(&local_7f0,"unable to spawn process \'");
            pvVar12 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_140,0);
            llvm::Twine::Twine(&local_808,pvVar12);
            llvm::operator+(&local_7d8,&local_7f0,&local_808);
            llvm::Twine::Twine(&local_820,"\' (");
            llvm::operator+(&local_7c0,&local_7d8,&local_820);
            sys::strerror_abi_cxx11_((sys *)&local_858,local_73c);
            local_859 = 1;
            llvm::Twine::Twine(&local_838,&local_858);
            llvm::operator+(&local_7a8,&local_7c0,&local_838);
            llvm::Twine::Twine(&local_878,")");
            llvm::operator+(&local_790,&local_7a8,&local_878);
          }
          (*delegate->_vptr_ProcessDelegate[3])(delegate,ctx,local_778,&local_790);
          if ((local_859 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_858);
          }
          pPVar15 = ctx;
          (*delegate->_vptr_ProcessDelegate[5])(delegate,ctx,commandLine_local.Length,local_770);
          iVar3 = (int)pPVar15;
          result.maxrss._4_4_ = 0xffffffff;
        }
        ManagedDescriptor::close((ManagedDescriptor *)&errorPair,iVar3);
        ManagedDescriptor::close((ManagedDescriptor *)&controlPipeChildEnd._line,iVar3);
        outputPipeChildEnd._20_4_ = 0;
      }
      else {
        pcVar10 = "control pipe";
        if (whatPipe.field_2._8_4_ == 1) {
          pcVar10 = "output pipe";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_5b0,pcVar10,&local_5b1);
        std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
        posix_spawn_file_actions_destroy((posix_spawn_file_actions_t *)local_418);
        posix_spawnattr_destroy((posix_spawnattr_t *)(noSignals.__val + 0xf));
        local_5c0 = commandLine_local.Length;
        (*delegate->_vptr_ProcessDelegate[2])
                  (delegate,ctx,commandLine_local.Length,(ulong)result.maxrss._4_4_);
        local_5c8 = commandLine_local.Length;
        std::operator+(&local_650,"unable to open ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5b0);
        std::operator+(&local_630,&local_650," (");
        llvm::Twine::Twine(&local_610,&local_630);
        pcVar10 = strerror(whatPipe.field_2._12_4_);
        llvm::Twine::Twine(&local_668,pcVar10);
        llvm::operator+(&local_5f8,&local_610,&local_668);
        llvm::Twine::Twine(&local_680,")");
        llvm::operator+(&local_5e0,&local_5f8,&local_680);
        (*delegate->_vptr_ProcessDelegate[3])(delegate,ctx,local_5c8,&local_5e0);
        std::__cxx11::string::~string((string *)&local_630);
        std::__cxx11::string::~string((string *)&local_650);
        local_688 = commandLine_local.Length;
        ProcessResult::makeFailed(&local_6b0,-1);
        (*delegate->_vptr_ProcessDelegate[5])(delegate,ctx,local_688,&local_6b0);
        iVar3 = 1;
        ProcessResult::ProcessResult((ProcessResult *)&controlFd,Failed,-1,-1,0,0,0);
        __args_00.pid = lStack_6d0;
        __args_00._12_4_ = uStack_6cc;
        __args_00.status = (undefined4)controlFd;
        __args_00.exitCode = controlFd._4_4_;
        __args_00.utime = local_6c8;
        __args_00.stime = uStack_6c0;
        __args_00.maxrss = local_6b8;
        std::function<void_(llbuild::basic::ProcessResult)>::operator()(completionFn,__args_00);
        outputPipeChildEnd._20_4_ = 1;
        std::__cxx11::string::~string((string *)local_5b0);
      }
      ManagedDescriptor::~ManagedDescriptor((ManagedDescriptor *)&errorPair);
      ManagedDescriptor::~ManagedDescriptor((ManagedDescriptor *)&controlPipeChildEnd._line);
    }
    std::lock_guard<std::mutex>::~lock_guard(&local_550);
    if ((outputPipeChildEnd._20_4_ == 0) || (outputPipeChildEnd._20_4_ == 8)) {
      posix_spawn_file_actions_destroy((posix_spawn_file_actions_t *)local_418);
      posix_spawnattr_destroy((posix_spawnattr_t *)(noSignals.__val + 0xf));
      if (result.maxrss._4_4_ == 0xffffffff) {
        ManagedDescriptor::close((ManagedDescriptor *)&controlPipeParentEnd._line,iVar3);
        ManagedDescriptor::close((ManagedDescriptor *)&taskID.LHSKind,iVar3);
        if ((guard._M_device._7_1_ & 1) == 0) {
          ProcessResult::makeFailed((ProcessResult *)local_8b0,-1);
        }
        else {
          ProcessResult::makeCancelled((ProcessResult *)local_8b0,-1);
        }
        memcpy(readfds + 1,local_8b0,0x28);
        __args_01._8_8_ = uStack_8d0;
        __args_01._0_8_ = readfds[1];
        __args_01.utime = local_8c8;
        __args_01.stime = uStack_8c0;
        __args_01.maxrss = local_8b8;
        std::function<void_(llbuild::basic::ProcessResult)>::operator()(completionFn,__args_01);
      }
      else {
        nfds = ManagedDescriptor::unsafeDescriptor((ManagedDescriptor *)&controlPipeParentEnd._line)
        ;
        local_8e4 = 0;
        sStack_8e2 = 0;
        readfds[0].fd = ManagedDescriptor::unsafeDescriptor((ManagedDescriptor *)&taskID.LHSKind);
        readfds[0].events = 0;
        readfds[0].revents = 0;
        control.maxLength._7_1_ = 0;
        control.maxLength._0_4_ = 2;
        llvm::Twine::str_abi_cxx11_((string *)&readCbs[1]._M_invoker,(Twine *)local_490);
        ControlProtocolState::ControlProtocolState
                  ((ControlProtocolState *)local_948,(string *)&readCbs[1]._M_invoker);
        std::__cxx11::string::~string((string *)&readCbs[1]._M_invoker);
        local_9c0.handle.id = commandLine_local.Length;
        local_9c0.delegate = delegate;
        local_9c0.ctx = ctx;
        std::function<bool(llvm::StringRef)>::
        function<llbuild::basic::spawnProcess(llbuild::basic::ProcessDelegate&,llbuild::basic::ProcessContext*,llbuild::basic::ProcessGroup&,llbuild::basic::ProcessHandle,llvm::ArrayRef<llvm::StringRef>,llbuild::basic::POSIXEnvironment,llbuild::basic::ProcessAttributes,std::function<void(std::function<void()>&&)>&&,std::function<void(llbuild::basic::ProcessResult)>&&)::__0,void>
                  ((function<bool(llvm::StringRef)> *)local_9a8,&local_9c0);
        local_9d8 = (ControlProtocolState *)local_948;
        local_9c8.id = commandLine_local.Length;
        __f = (anon_class_32_4_a872f8dc *)auStack_9e0;
        _auStack_9e0 = delegate;
        local_9d0 = ctx;
        std::function<bool(llvm::StringRef)>::
        function<llbuild::basic::spawnProcess(llbuild::basic::ProcessDelegate&,llbuild::basic::ProcessContext*,llbuild::basic::ProcessGroup&,llbuild::basic::ProcessHandle,llvm::ArrayRef<llvm::StringRef>,llbuild::basic::POSIXEnvironment,llbuild::basic::ProcessAttributes,std::function<void(std::function<void()>&&)>&&,std::function<void(llbuild::basic::ProcessResult)>&&)::__1,void>
                  ((function<bool(llvm::StringRef)> *)&readCbs[0]._M_invoker,__f);
        buf[0xffc] = '\0';
        buf[0xffd] = '\0';
        buf[0xffe] = '\0';
        buf[0xfff] = '\0';
        if ((attr.connectToConsole & 1U) == 0) {
          local_8e4 = 1;
          control.maxLength._7_1_ = 1;
        }
        if (((undefined1  [30])attr._2_30_ & (undefined1  [30])0x100000000000000) !=
            (undefined1  [30])0x0) {
          readfds[0].events = 1;
          control.maxLength._7_1_ = 1;
        }
        do {
          iVar3 = nfds;
          if ((control.maxLength._7_1_ & 1) == 0) {
            ManagedDescriptor::close((ManagedDescriptor *)&controlPipeParentEnd._line,(int)__f);
            cleanUpExecutedProcess
                      (delegate,pgrp,result.maxrss._4_4_,(ProcessHandle)commandLine_local.Length,ctx
                       ,completionFn,(ManagedDescriptor *)&taskID.LHSKind);
            goto LAB_001703e8;
          }
          control.maxLength._7_1_ = 0;
          FVar4 = ManagedDescriptor::unsafeDescriptor
                            ((ManagedDescriptor *)&controlPipeParentEnd._line);
          iVar1 = readfds[0].fd;
          if (iVar3 != FVar4) {
            __assert_fail("readfds[0].fd == outputPipeParentEnd.unsafeDescriptor()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp"
                          ,0x42f,
                          "void llbuild::basic::spawnProcess(ProcessDelegate &, ProcessContext *, ProcessGroup &, ProcessHandle, ArrayRef<StringRef>, POSIXEnvironment, ProcessAttributes, ProcessReleaseFn &&, ProcessCompletionFn &&)"
                         );
          }
          FVar4 = ManagedDescriptor::unsafeDescriptor((ManagedDescriptor *)&taskID.LHSKind);
          if (iVar1 != FVar4) {
            __assert_fail("readfds[1].fd == controlPipeParentEnd.unsafeDescriptor()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp"
                          ,0x430,
                          "void llbuild::basic::spawnProcess(ProcessDelegate &, ProcessContext *, ProcessGroup &, ProcessHandle, ArrayRef<StringRef>, POSIXEnvironment, ProcessAttributes, ProcessReleaseFn &&, ProcessCompletionFn &&)"
                         );
          }
          while( true ) {
            __f = (anon_class_32_4_a872f8dc *)0x2;
            iVar3 = poll((pollfd *)&nfds,2,-1);
            if (iVar3 != -1) break;
            piVar14 = __errno_location();
            local_19ec = *piVar14;
            if ((local_19ec != 0xb) && (local_19ec != 4)) {
              local_19f8 = commandLine_local.Length;
              llvm::Twine::Twine(&local_1a40,"failed to poll (");
              pcVar10 = strerror(local_19ec);
              llvm::Twine::Twine(&local_1a58,pcVar10);
              llvm::operator+(&local_1a28,&local_1a40,&local_1a58);
              llvm::Twine::Twine((Twine *)local_1a70,")");
              llvm::operator+(&local_1a10,&local_1a28,(Twine *)local_1a70);
              (*delegate->_vptr_ProcessDelegate[3])(delegate,ctx,local_19f8,&local_1a10);
              goto LAB_001703e8;
            }
          }
          for (numBytes._4_4_ = 0; numBytes._4_4_ < 2; numBytes._4_4_ = numBytes._4_4_ + 1) {
            if ((*(ushort *)((long)&stack0xfffffffffffff71e + (long)numBytes._4_4_ * 8) & 0x19) == 0
               ) {
LAB_00170218:
              control.maxLength._7_1_ =
                   (control.maxLength._7_1_ & 1) != 0 || (&local_8e4)[(long)numBytes._4_4_ * 4] != 0
              ;
            }
            else {
              __f = (anon_class_32_4_a872f8dc *)local_19e8;
              sStack_1a80 = read((&nfds)[(long)numBytes._4_4_ * 2],__f,0x1000);
              if ((long)sStack_1a80 < 0) {
                piVar14 = __errno_location();
                local_1a84 = *piVar14;
                local_1a90 = commandLine_local.Length;
                llvm::Twine::Twine(&local_1ad8,"unable to read process output (");
                pcVar10 = strerror(local_1a84);
                llvm::Twine::Twine(&local_1af0,pcVar10);
                llvm::operator+(&local_1ac0,&local_1ad8,&local_1af0);
                llvm::Twine::Twine(&local_1b08,")");
                llvm::operator+(&local_1aa8,&local_1ac0,&local_1b08);
                __f = (anon_class_32_4_a872f8dc *)ctx;
                (*delegate->_vptr_ProcessDelegate[3])(delegate,ctx,local_1a90,&local_1aa8);
              }
              local_1ce9 = 1;
              if (0 < (long)sStack_1a80) {
                __f = (anon_class_32_4_a872f8dc *)local_19e8;
                __args_02.Length = sStack_1a80;
                __args_02.Data = (char *)__f;
                bVar2 = std::function<bool_(llvm::StringRef)>::operator()
                                  ((function<bool_(llvm::StringRef)> *)
                                   &readCbs[(long)numBytes._4_4_ + -1]._M_invoker,__args_02);
                local_1ce9 = bVar2 ^ 0xff;
              }
              if ((local_1ce9 & 1) == 0) goto LAB_00170218;
              (&local_8e4)[(long)numBytes._4_4_ * 4] = 0;
            }
          }
          bVar2 = ControlProtocolState::shouldRelease((ControlProtocolState *)local_948);
        } while (!bVar2);
        std::make_shared<ManagedDescriptor,ManagedDescriptor>
                  ((ManagedDescriptor *)
                   &controlFdShared.
                    super___shared_ptr<ManagedDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::make_shared<ManagedDescriptor,ManagedDescriptor>((ManagedDescriptor *)local_1b38);
        local_1bc0.pid = result.maxrss._4_4_;
        local_1bc0.handle.id = commandLine_local.Length;
        local_1bc0.delegate = delegate;
        local_1bc0.pgrp = pgrp;
        local_1bc0.ctx = ctx;
        std::shared_ptr<ManagedDescriptor>::shared_ptr
                  (&local_1bc0.outputFdShared,
                   (shared_ptr<ManagedDescriptor> *)
                   &controlFdShared.
                    super___shared_ptr<ManagedDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::shared_ptr<ManagedDescriptor>::shared_ptr
                  (&local_1bc0.controlFdShared,(shared_ptr<ManagedDescriptor> *)local_1b38);
        std::function<void_(llbuild::basic::ProcessResult)>::function
                  (&local_1bc0.completionFn,completionFn);
        std::function<void()>::
        function<llbuild::basic::spawnProcess(llbuild::basic::ProcessDelegate&,llbuild::basic::ProcessContext*,llbuild::basic::ProcessGroup&,llbuild::basic::ProcessHandle,llvm::ArrayRef<llvm::StringRef>,llbuild::basic::POSIXEnvironment,llbuild::basic::ProcessAttributes,std::function<void(std::function<void()>&&)>&&,std::function<void(llbuild::basic::ProcessResult)>&&)::__2,void>
                  ((function<void()> *)&local_1b58,&local_1bc0);
        std::function<void_(std::function<void_()>_&&)>::operator()(releaseFn,&local_1b58);
        std::function<void_()>::~function(&local_1b58);
        spawnProcess(llbuild::basic::ProcessDelegate&,llbuild::basic::ProcessContext*,llbuild::basic::ProcessGroup&,llbuild::basic::ProcessHandle,llvm::ArrayRef<llvm::StringRef>,llbuild::basic::POSIXEnvironment,llbuild::basic::ProcessAttributes,std::function<void(std::function<void()>&&)>&&,std::function<void(llbuild::basic::ProcessResult)>&&)
        ::$_2::~__2((__2 *)&local_1bc0);
        std::shared_ptr<ManagedDescriptor>::~shared_ptr((shared_ptr<ManagedDescriptor> *)local_1b38)
        ;
        std::shared_ptr<ManagedDescriptor>::~shared_ptr
                  ((shared_ptr<ManagedDescriptor> *)
                   &controlFdShared.
                    super___shared_ptr<ManagedDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
LAB_001703e8:
        local_1d00 = (function<bool_(llvm::StringRef)> *)&readCbs[1]._M_invoker;
        do {
          local_1d00 = local_1d00 + -1;
          std::function<bool_(llvm::StringRef)>::~function(local_1d00);
        } while (local_1d00 != (function<bool_(llvm::StringRef)> *)local_9a8);
        ControlProtocolState::~ControlProtocolState((ControlProtocolState *)local_948);
      }
    }
    ManagedDescriptor::~ManagedDescriptor((ManagedDescriptor *)&taskID.LHSKind);
    ManagedDescriptor::~ManagedDescriptor((ManagedDescriptor *)&controlPipeParentEnd._line);
    std::__cxx11::string::~string((string *)&pipesConfig);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_160);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_140);
  }
  return;
}

Assistant:

void llbuild::basic::spawnProcess(
    ProcessDelegate& delegate,
    ProcessContext* ctx,
    ProcessGroup& pgrp,
    ProcessHandle handle,
    ArrayRef<StringRef> commandLine,
    POSIXEnvironment environment,
    ProcessAttributes attr,
    ProcessReleaseFn&& releaseFn,
    ProcessCompletionFn&& completionFn
) {
  llbuild_pid_t pid = (llbuild_pid_t)-1;
  
#if !defined(_WIN32) && !defined(HAVE_POSIX_SPAWN)
  auto result = ProcessResult::makeFailed();
  delegate.processStarted(ctx, handle, pid);
  delegate.processHadError(ctx, handle, Twine("process spawning is unavailable"));
  delegate.processFinished(ctx, handle, result);
  completionFn(result);
  return;
#else
  // Don't use lane release feature for console workloads.
  if (attr.connectToConsole) {
    attr.controlEnabled = false;
  }

#if defined(_WIN32)
  // Control channel support is broken (thread-unsafe) on Windows.
  attr.controlEnabled = false;
#endif

  if (commandLine.size() == 0) {
    auto result = ProcessResult::makeFailed();
    delegate.processStarted(ctx, handle, pid);
    delegate.processHadError(ctx, handle, Twine("no arguments for command"));
    delegate.processFinished(ctx, handle, result);
    completionFn(result);
    return;
  }

  // Form the complete C string command line.
  std::vector<std::string> argsStorage(commandLine.begin(), commandLine.end());
#if defined(_WIN32)
  std::string args = llbuild::basic::formatWindowsCommandString(argsStorage);

  // Convert the command line string to utf16
  llvm::SmallVector<llvm::UTF16, 20> u16Executable;
  llvm::SmallVector<llvm::UTF16, 20> u16CmdLine;
  llvm::convertUTF8ToUTF16String(argsStorage[0], u16Executable);
  llvm::convertUTF8ToUTF16String(args, u16CmdLine);
#else
  std::vector<const char*> args(argsStorage.size() + 1);
  for (size_t i = 0; i != argsStorage.size(); ++i) {
    args[i] = argsStorage[i].c_str();
  }
  args[argsStorage.size()] = nullptr;
#endif

#if defined(_WIN32)
  DWORD creationFlags = NORMAL_PRIORITY_CLASS |
                        CREATE_UNICODE_ENVIRONMENT;
  PROCESS_INFORMATION processInfo = {0};

#else
  // Initialize the spawn attributes.
  posix_spawnattr_t attributes;
  posix_spawnattr_init(&attributes);

  // Unmask all signals.
  sigset_t noSignals;
  sigemptyset(&noSignals);
  posix_spawnattr_setsigmask(&attributes, &noSignals);

  // Reset all signals to default behavior.
  //
  // On Linux, this can only be used to reset signals that are legal to
  // modify, so we have to take care about the set we use.
#if defined(__linux__)
  sigset_t mostSignals;
  sigemptyset(&mostSignals);
  for (int i = 1; i < SIGSYS; ++i) {
    if (i == SIGKILL || i == SIGSTOP) continue;
    sigaddset(&mostSignals, i);
  }
  posix_spawnattr_setsigdefault(&attributes, &mostSignals);
#else
  sigset_t mostSignals;
  sigfillset(&mostSignals);
  sigdelset(&mostSignals, SIGKILL);
  sigdelset(&mostSignals, SIGSTOP);
  posix_spawnattr_setsigdefault(&attributes, &mostSignals);
#endif // else !defined(_WIN32)

  // Establish a separate process group.
  posix_spawnattr_setpgroup(&attributes, 0);

  // Set the attribute flags.
  unsigned flags = POSIX_SPAWN_SETSIGMASK | POSIX_SPAWN_SETSIGDEF;
  if (!attr.connectToConsole) {
    flags |= POSIX_SPAWN_SETPGROUP;
  }

  // Close all other files by default.
  //
  // FIXME: Note that this is an Apple-specific extension, and we will have to
  // do something else on other platforms (and unfortunately, there isn't
  // really an easy answer other than using a stub executable).
#ifdef __APPLE__
  flags |= POSIX_SPAWN_CLOEXEC_DEFAULT;
#endif

  // On Darwin, set the QoS of launched processes to one of the current thread.
#ifdef __APPLE__
  posix_spawnattr_set_qos_class_np(&attributes, qos_class_self());
#endif

  posix_spawnattr_setflags(&attributes, flags);

  // Setup the file actions.
  posix_spawn_file_actions_t fileActions;
  posix_spawn_file_actions_init(&fileActions);

  bool usePosixSpawnChdirFallback = true;
  const auto workingDir = attr.workingDir.str();
  if (!workingDir.empty() &&
      posix_spawn_file_actions_addchdir(&fileActions, workingDir.c_str()) != ENOSYS) {
    usePosixSpawnChdirFallback = false;
  }

#endif

#if defined(_WIN32)
  /// Process startup information for Windows.
  STARTUPINFOW startupInfo = {0};
  PlatformSpecificPipesConfig& pipesConfig = startupInfo;
#else
  PlatformSpecificPipesConfig& pipesConfig = fileActions;
#endif

  // Automatically managed (released) descriptors for output and control pipes.
  // The child ends are forwarded to the child (and quickly released in the
  // parent). The parent ends are retained and read/written by the parent.
  ManagedDescriptor outputPipeParentEnd{__FILE__, __LINE__};
  ManagedDescriptor controlPipeParentEnd{__FILE__, __LINE__};

#if defined(_WIN32)
  llvm::SmallVector<llvm::UTF16, 20> u16Cwd;
  std::string workingDir = attr.workingDir.str();
  if (!workingDir.empty()) {
    llvm::convertUTF8ToUTF16String(workingDir, u16Cwd);
  }
#endif

  // Export a task ID to subprocesses.
  auto taskID = Twine::utohexstr(handle.id);
  environment.setIfMissing("LLBUILD_TASK_ID", taskID.str());

  // Resolve the executable path, if necessary.
  //
  // FIXME: This should be cached.
  if (!llvm::sys::path::is_absolute(argsStorage[0])) {
    auto res = llvm::sys::findProgramByName(argsStorage[0]);
    if (!res.getError()) {
      argsStorage[0] = *res;
#if defined(_WIN32)
      u16Executable.clear();
      llvm::convertUTF8ToUTF16String(argsStorage[0], u16Executable);
#else
      args[0] = argsStorage[0].c_str();
#endif
    }
  }

  // Spawn the command.
  bool wasCancelled;
  do {
      // We need to hold the spawn processes lock when we spawn, to ensure that
      // we don't create a process in between when we are cancelled.
      std::lock_guard<std::mutex> guard(pgrp.mutex);
      wasCancelled = pgrp.isClosed();

      // If we have been cancelled since we started, skip startup.
      if (wasCancelled) { break; }

      // The partf of the control pipes that are inherited by the child.
      ManagedDescriptor outputPipeChildEnd{__FILE__, __LINE__};
      ManagedDescriptor controlPipeChildEnd{__FILE__, __LINE__};

      // Open the communication channel under the mutex to avoid
      // leaking the wrong channel into other children started concurrently.
      auto errorPair = createCommunicationPipes(attr, pipesConfig, outputPipeParentEnd, outputPipeChildEnd, controlPipeParentEnd, controlPipeChildEnd);
      if (errorPair.first != CommunicationPipesCreationError::ERROR_NONE) {
        std::string whatPipe = errorPair.first == CommunicationPipesCreationError::OUTPUT_PIPE_FAILED ? "output pipe" : "control pipe";
#if !defined(_WIN32)
        posix_spawn_file_actions_destroy(&fileActions);
        posix_spawnattr_destroy(&attributes);
#endif
        delegate.processStarted(ctx, handle, pid);
        delegate.processHadError(ctx, handle,
            Twine("unable to open " + whatPipe + " (") + strerror(errorPair.second) + ")");
        delegate.processFinished(ctx, handle, ProcessResult::makeFailed());
        completionFn(ProcessResult(ProcessStatus::Failed));
        return;
      }

      if (controlPipeChildEnd.isValid()) {
        long long controlFd = (long long)controlPipeChildEnd.unsafeDescriptor();
        environment.setIfMissing("LLBUILD_CONTROL_FD", Twine(controlFd).str());
      }

      int result = 0;

      bool workingDirectoryUnsupported = false;

#if !defined(_WIN32)
      if (usePosixSpawnChdirFallback) {
#if defined(__APPLE__)
        thread_local std::string threadWorkingDir;

        if (workingDir.empty()) {
          if (!threadWorkingDir.empty()) {
            pthread_fchdir_np(-1);
            threadWorkingDir.clear();
          }
        } else {
          if (threadWorkingDir != workingDir) {
            if (pthread_chdir_np(workingDir.c_str()) == -1) {
              result = errno;
            } else {
              threadWorkingDir = workingDir;
            }
          }
        }
#else
        if (!workingDir.empty()) {
          workingDirectoryUnsupported = true;
          result = -1;
        }
#endif // if defined(__APPLE__)
      }
#endif // else !defined(_WIN32)

      if (result == 0) {
#if defined(_WIN32)
        auto unicodeEnv = environment.getWindowsEnvp();
        result = !CreateProcessW(
            /*lpApplicationName=*/(LPWSTR)u16Executable.data(),
            (LPWSTR)u16CmdLine.data(),
            /*lpProcessAttributes=*/NULL,
            /*lpThreadAttributes=*/NULL,
            /*bInheritHandles=*/TRUE, creationFlags,
            /*lpEnvironment=*/unicodeEnv.get(),
            /*lpCurrentDirectory=*/u16Cwd.empty() ? NULL
                                                  : (LPWSTR)u16Cwd.data(),
            &startupInfo, &processInfo);
#else
        result =
            posix_spawn(&pid, args[0], /*file_actions=*/&fileActions,
                        /*attrp=*/&attributes, const_cast<char**>(args.data()),
                        const_cast<char* const*>(environment.getEnvp()));
#endif
      }
    
      delegate.processStarted(ctx, handle, pid);

      if (result != 0) {
        auto processResult = ProcessResult::makeFailed();
#if defined(_WIN32)
        result = GetLastError();
#endif
        delegate.processHadError(
            ctx, handle,
            workingDirectoryUnsupported
                ? Twine("working-directory unsupported on this platform")
                : Twine("unable to spawn process '") + argsStorage[0] + "' (" + sys::strerror(result) +
                      ")");
        delegate.processFinished(ctx, handle, processResult);
        pid = (llbuild_pid_t)-1;
      } else {
#if defined(_WIN32)
        pid = processInfo.hProcess;
#endif
        ProcessInfo info{ attr.canSafelyInterrupt };
        pgrp.add(std::move(guard), pid, info);
      }

    // Close the child ends of the forwarded output and control pipes.
    controlPipeChildEnd.close();
    outputPipeChildEnd.close();
  } while(false);

#if !defined(_WIN32)
  posix_spawn_file_actions_destroy(&fileActions);
  posix_spawnattr_destroy(&attributes);
#endif

  // If we failed to launch a process, clean up and abort.
  if (pid == (llbuild_pid_t)-1) {
    // Manually close to avoid triggering debug-time leak check.
    outputPipeParentEnd.close();
    controlPipeParentEnd.close();
    auto result = wasCancelled ? ProcessResult::makeCancelled() : ProcessResult::makeFailed();
    completionFn(result);
    return;
  }

#if !defined(_WIN32)
  // Set up our poll() structures. We use assert() to ensure
  // the file descriptors are alive.
  pollfd readfds[] = {
    { outputPipeParentEnd.unsafeDescriptor(), 0, 0 },
    { controlPipeParentEnd.unsafeDescriptor(), 0, 0 }
  };
  bool activeEvents = false;
#endif
  const int nfds = 2;
  ControlProtocolState control(taskID.str());
  std::function<bool (StringRef)> readCbs[] = {
    // output capture callback
    [&delegate, ctx, handle](StringRef buf) -> bool {
      // Notify the client of the output.
      delegate.processHadOutput(ctx, handle, buf);
      return true;
    },
    // control callback handle
    [&delegate, &control, ctx, handle](StringRef buf) mutable -> bool {
      std::string errstr;
      int ret = control.read(buf, &errstr);
      if (ret < 0) {
        delegate.processHadError(ctx, handle,
                                 Twine("control protocol error" + errstr));
      }
      return (ret == 0);
    }
  };
#if defined(_WIN32)
  struct threadData {
    std::function<void(void*)> reader;
    const ManagedDescriptor& handle;
    std::function<bool(StringRef)> cb;
  };
  HANDLE readers[2] = {NULL, NULL};
  auto reader = [&delegate, handle, ctx](void* lpArgs) {
    threadData* args = (threadData*)lpArgs;
    for (;;) {
      char buf[4096];
      DWORD numBytes;
      bool result = ReadFile(args->handle.unsafeDescriptor(), buf, sizeof(buf), &numBytes, NULL);

      if (!result || numBytes == 0) {
        if (GetLastError() == ERROR_BROKEN_PIPE) {
          // Pipe done, exit
          return;
        } else {
          delegate.processHadError(ctx, handle,
                                   Twine("unable to read process output (") +
                                       sys::strerror(GetLastError()) + ")");
        }
      }

      if (numBytes <= 0 || !args->cb(StringRef(buf, numBytes))) {
        continue;
      }
    }
  };

  struct threadData outputThreadParams = {reader, outputPipeParentEnd, readCbs[0]};
  struct threadData controlThreadParams = {reader, controlPipeParentEnd, readCbs[1]};
  HANDLE threads[2] = {NULL, NULL};
#endif // defined(_WIN32)

  int threadCount = 0;

  // Read the command output, if capturing instead of pass-throughing.
  if (!attr.connectToConsole) {
#if defined(_WIN32)
    threads[threadCount++] = (HANDLE)_beginthread(
        [](LPVOID lpParams) { ((threadData*)lpParams)->reader(lpParams); }, 0,
        &outputThreadParams);
#else
    readfds[0].events = POLLIN;
    activeEvents = true;
    (void)threadCount;
#endif
  }

  // Process the control channel input.
  if (attr.controlEnabled) {
#if defined(_WIN32)
    threads[threadCount++] = (HANDLE)_beginthread(
        [](LPVOID lpParams) { ((threadData*)lpParams)->reader(lpParams); }, 0,
        &controlThreadParams);
#else
    readfds[1].events = POLLIN;
    activeEvents = true;
#endif
  }

#if defined(_WIN32)
  DWORD waitResult = WaitForMultipleObjects(threadCount, threads,
                                            /*bWaitAll=*/false,
                                            /*dwMilliseconds=*/INFINITE);
  if (WAIT_FAILED == waitResult || WAIT_TIMEOUT == waitResult) {
    int err = GetLastError();
    delegate.processHadError(
        ctx, handle, Twine("failed to poll (") + sys::strerror(err) + ")");
  }
#else  // !defined(_WIN32)
  while (activeEvents) {
    char buf[4096];
    activeEvents = false;

    // Ensure we haven't autoclosed the file descriptors,
    // or move()d somewhere they could be autoclosed in.
    assert(readfds[0].fd == outputPipeParentEnd.unsafeDescriptor());
    assert(readfds[1].fd == controlPipeParentEnd.unsafeDescriptor());

    while (poll(readfds, nfds, -1) == -1) {
        int err = errno;

        if (err == EAGAIN || err == EINTR) {
          continue;
        } else {
          delegate.processHadError(ctx, handle,
            Twine("failed to poll (") + strerror(err) + ")"); 
          return;
        }
    }

    for (int i = 0; i < nfds; i++) {
      if (readfds[i].revents & (POLLIN | POLLERR | POLLHUP)) {
        ssize_t numBytes = read(readfds[i].fd, buf, sizeof(buf));
        if (numBytes < 0) {
          int err = errno;
          delegate.processHadError(ctx, handle,
              Twine("unable to read process output (") + strerror(err) + ")");
        }
        if (numBytes <= 0 || !readCbs[i](StringRef(buf, numBytes))) {
          readfds[i].events = 0;
          continue;
        }
      }
      activeEvents |= readfds[i].events != 0;
    }

    if (control.shouldRelease()) {
      std::shared_ptr<ManagedDescriptor> outputFdShared
        = std::make_shared<ManagedDescriptor>(std::move(outputPipeParentEnd));
      std::shared_ptr<ManagedDescriptor> controlFdShared
        = std::make_shared<ManagedDescriptor>(std::move(controlPipeParentEnd));
      releaseFn([&delegate, &pgrp, pid, handle, ctx,
                 outputFdShared, controlFdShared,
                 completionFn=std::move(completionFn)]() mutable {
        if (outputFdShared->isValid()) {
          captureExecutedProcessOutput(delegate, *outputFdShared, handle, ctx);
        }
        cleanUpExecutedProcess(delegate, pgrp, pid, handle, ctx,
                               std::move(completionFn), *controlFdShared);
      });
      return;
    }

  }
#endif // else !defined(_WIN32)
  // If we have reached here, both the control and read pipes have given us
  // the requisite EOF/hang-up events. Safe to close the read end of the
  // output pipe.
  outputPipeParentEnd.close();
  cleanUpExecutedProcess(delegate, pgrp, pid, handle, ctx,
                         std::move(completionFn), controlPipeParentEnd);
#endif
}